

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O2

void bloaty::macho::ReadDebugSectionsFromSegment<segment_command,section>
               (LoadCommand cmd,File *dwarf,RangeSink *sink)

{
  bool bVar1;
  uint uVar2;
  segment_command *psVar3;
  section *s;
  size_type sVar4;
  string_view *psVar5;
  unsigned_long uncompressed_size;
  size_t off;
  RangeSink *maxlen;
  char *n;
  uint32_t uVar6;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  string_view sVar7;
  string_view name;
  string_view name_00;
  string_view sectname;
  string_view contents;
  
  maxlen = sink;
  psVar3 = GetStructPointerAndAdvance<segment_command>(&cmd.command_data);
  sVar7 = ArrayToStr(psVar3->segname,(size_t)maxlen);
  name._M_len = sVar7._M_str;
  n = (char *)0x7;
  __y._M_str = "__DWARF";
  __y._M_len = 7;
  bVar1 = std::operator!=(sVar7,__y);
  if (!bVar1) {
    uVar6 = psVar3->nsects;
    while (bVar1 = uVar6 != 0, uVar6 = uVar6 - 1, bVar1) {
      s = GetStructPointerAndAdvance<section>(&cmd.command_data);
      sectname = ArrayToStr(s->sectname,(size_t)name._M_len);
      off = (size_t)s->size;
      uVar2 = (uint)(byte)s->flags;
      if ((uVar2 < 0x13) && ((0x41002U >> (uVar2 & 0x1f) & 1) != 0)) {
        off = 0;
      }
      sVar7._M_str._0_4_ = s->offset;
      sVar7._M_len = (size_t)cmd.file_data._M_str;
      sVar7._M_str._4_4_ = 0;
      contents = StrictSubstr((bloaty *)cmd.file_data._M_len,sVar7,off,(size_t)n);
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find(&sectname,"__debug_",0);
      if (sVar4 == 0) {
        name_00._M_str = sectname._M_str + 8;
        name_00._M_len = (char *)(sectname._M_len - 8);
        sectname._M_str = name_00._M_str;
        sectname._M_len = (size_t)name_00._M_len;
        n = contents._M_str;
        bloaty::dwarf::File::SetFieldByName(dwarf,name_00,contents);
        name._M_len = name_00._M_len;
      }
      else {
        name._M_len = "__zdebug_";
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find(&sectname,"__zdebug_",0)
        ;
        if (sVar4 == 0) {
          name._M_str = sectname._M_str + 9;
          name._M_len = (char *)(sectname._M_len - 9);
          sectname._M_str = name._M_str;
          sectname._M_len = (size_t)name._M_len;
          psVar5 = bloaty::dwarf::File::GetFieldByName(dwarf,name);
          if (psVar5 != (string_view *)0x0) {
            sVar7 = ReadBytes(4,&contents);
            name._M_len = sVar7._M_str;
            __y_00._M_str = "ZLIB";
            __y_00._M_len = 4;
            bVar1 = std::operator!=(sVar7,__y_00);
            if (!bVar1) {
              uncompressed_size = ReadBigEndian<unsigned_long>(&contents);
              name._M_len = (char *)contents._M_len;
              sVar7 = RangeSink::ZlibDecompress(sink,contents,uncompressed_size);
              *psVar5 = sVar7;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ReadDebugSectionsFromSegment(LoadCommand cmd, dwarf::File *dwarf,
                                  RangeSink *sink) {
  auto segment = GetStructPointerAndAdvance<Segment>(&cmd.command_data);
  string_view segname = ArrayToStr(segment->segname, 16);

  if (segname != "__DWARF") {
    return;
  }

  uint32_t nsects = segment->nsects;
  for (uint32_t j = 0; j < nsects; j++) {
    auto section = GetStructPointerAndAdvance<Section>(&cmd.command_data);
    string_view sectname = ArrayToStr(section->sectname, 16);

    // filesize equals vmsize unless the section is zerofill
    uint64_t filesize = section->size;
    switch (section->flags & SECTION_TYPE) {
      case S_ZEROFILL:
      case S_GB_ZEROFILL:
      case S_THREAD_LOCAL_ZEROFILL:
        filesize = 0;
        break;
      default:
        break;
    }

    string_view contents =
        StrictSubstr(cmd.file_data, section->offset, filesize);

    if (sectname.find("__debug_") == 0) {
      sectname.remove_prefix(string_view("__debug_").size());
      dwarf->SetFieldByName(sectname, contents);
    } else if (sectname.find("__zdebug_") == 0) {
      sectname.remove_prefix(string_view("__zdebug_").size());
      string_view *member = dwarf->GetFieldByName(sectname);
      if (!member || ReadBytes(4, &contents) != "ZLIB") {
        continue;
      }
      auto uncompressed_size = ReadBigEndian<uint64_t>(&contents);
      *member = sink->ZlibDecompress(contents, uncompressed_size);
    }
  }
}